

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void __thiscall ExampleAppConsole::ExecCommand(ExampleAppConsole *this,char *command_line)

{
  int iVar1;
  uint uVar2;
  char **ppcVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  char *__dest;
  char **__dest_00;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  AddLog(this,"# %s\n",command_line);
  this->HistoryPos = -1;
  uVar8 = (ulong)(this->History).Size;
  do {
    if ((long)uVar8 < 1) goto LAB_0014edf2;
    lVar9 = uVar8 - 1;
    uVar8 = uVar8 - 1;
    iVar4 = Stricmp((this->History).Data[lVar9],command_line);
  } while (iVar4 != 0);
  free((this->History).Data[uVar8]);
  ppcVar3 = (this->History).Data;
  uVar8 = uVar8 & 0xffffffff;
  memmove(ppcVar3 + uVar8,ppcVar3 + uVar8 + 1,(~uVar8 + (long)(this->History).Size) * 8);
  (this->History).Size = (this->History).Size + -1;
LAB_0014edf2:
  sVar6 = strlen(command_line);
  __dest = (char *)malloc(sVar6 + 1);
  memcpy(__dest,command_line,sVar6 + 1);
  iVar4 = (this->History).Size;
  iVar1 = (this->History).Capacity;
  if (iVar4 == iVar1) {
    iVar4 = iVar4 + 1;
    if (iVar1 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar1 / 2 + iVar1;
    }
    if (iVar4 < iVar7) {
      iVar4 = iVar7;
    }
    if (iVar1 < iVar4) {
      __dest_00 = (char **)ImGui::MemAlloc((long)iVar4 << 3);
      ppcVar3 = (this->History).Data;
      if (ppcVar3 != (char **)0x0) {
        memcpy(__dest_00,ppcVar3,(long)(this->History).Size << 3);
        ImGui::MemFree((this->History).Data);
      }
      (this->History).Data = __dest_00;
      (this->History).Capacity = iVar4;
    }
  }
  (this->History).Data[(this->History).Size] = __dest;
  (this->History).Size = (this->History).Size + 1;
  iVar4 = Stricmp(command_line,"CLEAR");
  if (iVar4 == 0) {
    ClearLog(this);
  }
  else {
    iVar4 = Stricmp(command_line,"HELP");
    if (iVar4 == 0) {
      AddLog(this,"Commands:");
      if (0 < (this->Commands).Size) {
        lVar9 = 0;
        do {
          AddLog(this,"- %s",(this->Commands).Data[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (this->Commands).Size);
      }
    }
    else {
      iVar4 = Stricmp(command_line,"HISTORY");
      if (iVar4 == 0) {
        uVar2 = (this->History).Size;
        uVar5 = 10;
        if (10 < (int)uVar2) {
          uVar5 = uVar2;
        }
        if ((int)(uVar5 - 10) < (int)uVar2) {
          uVar8 = (ulong)uVar5 - 10;
          do {
            AddLog(this,"%3d: %s\n",uVar8 & 0xffffffff,(this->History).Data[uVar8]);
            uVar8 = uVar8 + 1;
          } while ((long)uVar8 < (long)(this->History).Size);
        }
      }
      else {
        AddLog(this,"Unknown command: \'%s\'\n",command_line);
      }
    }
  }
  this->ScrollToBottom = true;
  return;
}

Assistant:

void    ExecCommand(const char* command_line)
    {
        AddLog("# %s\n", command_line);

        // Insert into history. First find match and delete it so it can be pushed to the back.
        // This isn't trying to be smart or optimal.
        HistoryPos = -1;
        for (int i = History.Size - 1; i >= 0; i--)
            if (Stricmp(History[i], command_line) == 0)
            {
                free(History[i]);
                History.erase(History.begin() + i);
                break;
            }
        History.push_back(Strdup(command_line));

        // Process command
        if (Stricmp(command_line, "CLEAR") == 0)
        {
            ClearLog();
        }
        else if (Stricmp(command_line, "HELP") == 0)
        {
            AddLog("Commands:");
            for (int i = 0; i < Commands.Size; i++)
                AddLog("- %s", Commands[i]);
        }
        else if (Stricmp(command_line, "HISTORY") == 0)
        {
            int first = History.Size - 10;
            for (int i = first > 0 ? first : 0; i < History.Size; i++)
                AddLog("%3d: %s\n", i, History[i]);
        }
        else
        {
            AddLog("Unknown command: '%s'\n", command_line);
        }

        // On command input, we scroll to bottom even if AutoScroll==false
        ScrollToBottom = true;
    }